

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec2 tcu::projectToFace(CubeFace face,Vec3 *coord)

{
  float fVar1;
  Vec2 VVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  ulong *in_RDX;
  undefined4 in_register_0000003c;
  float fVar5;
  float fVar6;
  float fVar8;
  ulong uVar7;
  undefined8 in_XMM2_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (5 < (uint)coord) {
    auVar10 = ZEXT816(0);
    fVar6 = 0.0;
    fVar5 = 0.0;
    goto LAB_019b2957;
  }
  uVar7 = *in_RDX;
  fVar1 = *(float *)(in_RDX + 1);
  fVar6 = 0.0;
  fVar8 = (float)(uVar7 >> 0x20);
  switch((ulong)coord & 0xffffffff) {
  case 0:
    uVar7 = uVar7 ^ 0x8000000080000000;
    auVar4._4_8_ = in_XMM2_Qa;
    auVar4._0_4_ = -fVar8;
    auVar9._0_8_ = auVar4._0_8_ << 0x20;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar10._4_12_ = auVar9._4_12_;
    auVar10._0_4_ = fVar1;
    break;
  case 1:
    auVar10._0_8_ = CONCAT44(fVar8,fVar1) ^ 0x8000000080000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0x80000000;
    break;
  case 2:
    fVar5 = -fVar8;
    fVar6 = -fVar8;
    auVar10._0_8_ = CONCAT44(fVar1,(int)uVar7) ^ 0x8000000000000000;
    auVar10._8_8_ = 0;
    goto LAB_019b2957;
  case 3:
    auVar10._4_4_ = fVar1;
    auVar10._0_4_ = (int)uVar7;
    auVar10._8_8_ = 0;
    uVar7 = CONCAT44(fVar8,fVar8);
    break;
  case 4:
    fVar6 = -0.0;
    fVar5 = -fVar1;
    auVar10._0_8_ = uVar7 ^ 0x8000000080000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0x80000000;
    goto LAB_019b2957;
  case 5:
    auVar10._0_8_ = uVar7 ^ 0x8000000000000000;
    auVar10._8_8_ = 0;
    fVar5 = fVar1;
    goto LAB_019b2957;
  }
  fVar5 = (float)uVar7;
  fVar6 = (float)(uVar7 >> 0x20);
LAB_019b2957:
  auVar3._4_4_ = fVar5;
  auVar3._0_4_ = fVar5;
  auVar3._8_4_ = fVar6;
  auVar3._12_4_ = fVar6;
  auVar10 = divps(auVar10,auVar3);
  *(ulong *)CONCAT44(in_register_0000003c,face) =
       CONCAT44((auVar10._4_4_ + 1.0) * 0.5,(auVar10._0_4_ + 1.0) * 0.5);
  VVar2.m_data[1] = fVar5;
  VVar2.m_data[0] = fVar5;
  return (Vec2)VVar2.m_data;
}

Assistant:

Vec2 projectToFace (CubeFace face, const Vec3& coord)
{
	const float	rx		= coord.x();
	const float	ry		= coord.y();
	const float	rz		= coord.z();
	float		sc		= 0.0f;
	float		tc		= 0.0f;
	float		ma		= 0.0f;
	float		s;
	float		t;

	switch (face)
	{
		case CUBEFACE_NEGATIVE_X: sc = +rz; tc = -ry; ma = -rx; break;
		case CUBEFACE_POSITIVE_X: sc = -rz; tc = -ry; ma = +rx; break;
		case CUBEFACE_NEGATIVE_Y: sc = +rx; tc = -rz; ma = -ry; break;
		case CUBEFACE_POSITIVE_Y: sc = +rx; tc = +rz; ma = +ry; break;
		case CUBEFACE_NEGATIVE_Z: sc = -rx; tc = -ry; ma = -rz; break;
		case CUBEFACE_POSITIVE_Z: sc = +rx; tc = -ry; ma = +rz; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	// Compute s, t
	s = ((sc / ma) + 1.0f) / 2.0f;
	t = ((tc / ma) + 1.0f) / 2.0f;

	return Vec2(s, t);
}